

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

int p_count(parse *p)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  ushort **ppuVar4;
  int iVar5;
  long lVar6;
  
  pcVar2 = p->next;
  pcVar3 = p->end;
  iVar5 = 0;
  for (lVar6 = 0; pcVar1 = pcVar2 + lVar6, pcVar1 < pcVar3; lVar6 = lVar6 + 1) {
    ppuVar4 = __ctype_b_loc();
    if (((*(byte *)((long)*ppuVar4 + (long)*pcVar1 * 2 + 1) & 8) == 0) || (0xff < iVar5)) break;
    p->next = pcVar1 + 1;
    iVar5 = iVar5 * 10 + (int)*pcVar1 + -0x30;
  }
  if (((int)lVar6 == 0) || (0xff < iVar5)) {
    if (p->error == 0) {
      p->error = 10;
    }
    p->next = nuls;
    p->end = nuls;
  }
  return iVar5;
}

Assistant:

static int			/* the value */
p_count(p)
struct parse *p;
{
	int count = 0;
	int ndigits = 0;

	while (MORE() && isdigit(PEEK()) && count <= DUPMAX) {
		count = count*10 + (GETNEXT() - '0');
		ndigits++;
	}

	REQUIRE(ndigits > 0 && count <= DUPMAX, REG_BADBR);
	return(count);
}